

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::GetSourceFilesWithoutObjectLibraries
          (cmGeneratorTarget *this,vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *files,
          string *config)

{
  size_type sVar1;
  KindedSources *pKVar2;
  pointer __x;
  string sStack_48;
  
  pKVar2 = GetKindedSources(this,config);
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::reserve
            (files,(long)(pKVar2->Sources).
                         super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pKVar2->Sources).
                         super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4);
  for (__x = (pKVar2->Sources).
             super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
             ._M_impl.super__Vector_impl_data._M_start;
      __x != (pKVar2->Sources).
             super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
             ._M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
    cmSourceFile::GetObjectLibrary_abi_cxx11_(&sStack_48,__x->Source);
    sVar1 = sStack_48._M_string_length;
    std::__cxx11::string::~string((string *)&sStack_48);
    if (sVar1 == 0) {
      std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back(files,&__x->Source);
    }
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetSourceFilesWithoutObjectLibraries(
  std::vector<cmSourceFile*>& files, const std::string& config) const
{
  KindedSources const& kinded = this->GetKindedSources(config);
  files.reserve(kinded.Sources.size());
  for (std::vector<SourceAndKind>::const_iterator si = kinded.Sources.begin();
       si != kinded.Sources.end(); ++si) {
    if (si->Source->GetObjectLibrary().empty()) {
      files.push_back(si->Source);
    }
  }
}